

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void __thiscall FNotifyBuffer::Tick(FNotifyBuffer *this)

{
  int iVar1;
  int iVar2;
  FNotifyText *pFVar3;
  uint uVar4;
  uint deletecount;
  
  iVar1 = this->Top;
  iVar2 = 1;
  if ((iVar1 < this->TopGoal) || (iVar2 = -1, this->TopGoal < iVar1)) {
    this->Top = iVar1 + iVar2;
  }
  deletecount = (this->Text).Count;
  if (deletecount == 0) {
    return;
  }
  pFVar3 = (this->Text).Array;
  uVar4 = 0;
  while ((pFVar3->TimeOut == 0 || (pFVar3->TimeOut <= gametic))) {
    uVar4 = uVar4 + 1;
    pFVar3 = pFVar3 + 1;
    if (deletecount == uVar4) {
LAB_0035436b:
      TArray<FNotifyText,_FNotifyText>::Delete(&this->Text,0,deletecount);
      return;
    }
  }
  deletecount = uVar4;
  if (uVar4 == 0) {
    return;
  }
  goto LAB_0035436b;
}

Assistant:

void FNotifyBuffer::Tick()
{
	if (TopGoal > Top)
	{
		Top++;
	}
	else if (TopGoal < Top)
	{
		Top--;
	}

	// Remove lines from the beginning that have expired.
	unsigned i;
	for (i = 0; i < Text.Size(); ++i)
	{
		if (Text[i].TimeOut != 0 && Text[i].TimeOut > gametic)
			break;
	}
	if (i > 0)
	{
		Text.Delete(0, i);
	}
}